

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

uint luckyCanonicizer_final_fast1(word *pInOut,int nVars,char *pCanonPerm)

{
  word wVar1;
  uint local_6c;
  int local_68;
  uint uCanonPhase;
  int pStore [16];
  int nWords;
  char *pCanonPerm_local;
  int nVars_local;
  word *pInOut_local;
  
  local_6c = 0;
  if (nVars < 7) {
    wVar1 = luckyCanonicizer_final_fast_6Vars1(*pInOut,&local_68,pCanonPerm,&local_6c);
    *pInOut = wVar1;
  }
  else {
    if (0x10 < nVars) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                    ,0x35c,"unsigned int luckyCanonicizer_final_fast1(word *, int, char *)");
    }
    pStore[0xf] = 1 << ((char)nVars - 6U & 0x1f);
    luckyCanonicizer_final_fast_16Vars1(pInOut,nVars,pStore[0xf],&local_68,pCanonPerm,&local_6c);
  }
  return local_6c;
}

Assistant:

unsigned luckyCanonicizer_final_fast1( word * pInOut, int nVars, char * pCanonPerm)
{
    int nWords;
    int pStore[16];
    unsigned uCanonPhase = 0;
#ifdef LUCKY_VERIFY
    word temp[1024] = {0};
    word duplicate[1024] = {0};
    Kit_TruthCopy_64bit( duplicate, pInOut, nVars );
#endif
    if ( nVars <= 6 )
        pInOut[0] = luckyCanonicizer_final_fast_6Vars1( pInOut[0], pStore, pCanonPerm, &uCanonPhase);
    else if ( nVars <= 16 )
    {
        nWords = 1 << (nVars - 6);
        luckyCanonicizer_final_fast_16Vars1( pInOut, nVars, nWords, pStore, pCanonPerm, &uCanonPhase );
    }
    else assert( 0 );
#ifdef LUCKY_VERIFY
    Kit_TruthCopy_64bit( temp, pInOut, nVars );
    assert( ! luckyCheck(temp, duplicate, nVars, pCanonPerm, uCanonPhase) );
#endif
    return uCanonPhase;
}